

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_rel_gain_weighted_t<double,double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>>
                 (double *x,double xmean,size_t *ix_arr,size_t st,size_t end,double *split_point,
                 size_t *split_ix,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  size_t row;
  size_t sVar1;
  ulong uVar2;
  size_t *psVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar8;
  double local_70;
  double local_68;
  
  *split_ix = 0;
  psVar3 = ix_arr + st;
  local_68 = 0.0;
  for (sVar1 = st; sVar1 <= end; sVar1 = sVar1 + 1) {
    pVar8 = tsl::detail_robin_hash::
            robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
            ::try_emplace<unsigned_long_const&>
                      ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                        *)w,psVar3);
    local_68 = local_68 + *(double *)((pVar8.first.m_bucket.m_bucket)->m_value + 8);
    psVar3 = psVar3 + 1;
  }
  dVar5 = 0.0;
  for (sVar1 = st; sVar1 <= end; sVar1 = sVar1 + 1) {
    dVar5 = dVar5 + (x[ix_arr[sVar1]] - xmean);
  }
  dVar6 = 0.0;
  local_70 = -INFINITY;
  dVar7 = 0.0;
  uVar2 = 0;
  do {
    psVar3 = ix_arr + st;
    sVar1 = st;
    while( true ) {
      if (end <= sVar1) {
        if (-INFINITY < local_70) {
          dVar5 = midpoint<double>(x[ix_arr[uVar2]],x[ix_arr[uVar2 + 1]]);
          *split_point = dVar5;
          if (local_70 <= 2.220446049250313e-16) {
            local_70 = 2.220446049250313e-16;
          }
        }
        else {
          local_70 = -INFINITY;
        }
        return local_70;
      }
      pVar8 = tsl::detail_robin_hash::
              robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              ::try_emplace<unsigned_long_const&>
                        ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                          *)w,psVar3);
      dVar7 = dVar7 + *(double *)((pVar8.first.m_bucket.m_bucket)->m_value + 8);
      dVar4 = x[*psVar3];
      dVar6 = dVar6 + (dVar4 - xmean);
      if (((dVar4 != x[psVar3[1]]) || (NAN(dVar4) || NAN(x[psVar3[1]]))) &&
         (dVar4 = (dVar6 / dVar7) * dVar6 + ((dVar5 - dVar6) / (local_68 - dVar7)) * (dVar5 - dVar6)
         , local_70 < dVar4)) break;
      psVar3 = psVar3 + 1;
      sVar1 = sVar1 + 1;
    }
    *split_ix = sVar1;
    st = sVar1 + 1;
    uVar2 = sVar1;
    local_70 = dVar4;
  } while( true );
}

Assistant:

double find_split_rel_gain_weighted_t(real_t_ *restrict x, real_t_ xmean, size_t *restrict ix_arr, size_t st, size_t end, double &split_point, size_t &restrict split_ix, mapping &restrict w)
{
    real_t this_gain;
    real_t best_gain = -HUGE_VAL;
    split_ix = 0; /* <- avoid out-of-bounds at the end */
    real_t sum_left = 0, sum_right = 0, sum_tot = 0, sumw = 0, sumw_tot = 0;

    for (size_t row = st; row <= end; row++)
        sumw_tot += w[ix_arr[row]];
    for (size_t row = st; row <= end; row++)
        sum_tot += x[ix_arr[row]] - xmean;
    for (size_t row = st; row < end; row++)
    {
        sumw += w[ix_arr[row]];
        sum_left += x[ix_arr[row]] - xmean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        sum_right = sum_tot - sum_left;
        this_gain =   sum_left  * (sum_left  / sumw)
                    + sum_right * (sum_right / (sumw_tot - sumw));
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain <= -HUGE_VAL)
        return best_gain;
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return std::fmax((double)best_gain, std::numeric_limits<double>::epsilon());
}